

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::SpellSelf(Map *this,Character *from,unsigned_short spell_id)

{
  World *pWVar1;
  Character *other;
  bool bVar2;
  int iVar3;
  mapped_type *this_00;
  int *piVar4;
  reference ppCVar5;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  int local_a8;
  int local_a4;
  undefined1 local_a0 [8];
  PacketBuilder builder;
  int local_68 [5];
  allocator<char> local_51;
  key_type local_50;
  int local_2c;
  ESF_Data *pEStack_28;
  int hpgain;
  ESF_Data *spell;
  Character *pCStack_18;
  unsigned_short spell_id_local;
  Character *from_local;
  Map *this_local;
  
  spell._6_2_ = spell_id;
  pCStack_18 = from;
  from_local = (Character *)this;
  pEStack_28 = ESF::Get(from->world->esf,(uint)spell_id);
  bVar2 = ESF_Data_Base::operator_cast_to_bool((ESF_Data_Base *)pEStack_28);
  if (((bVar2) && (pEStack_28->type == Heal)) && ((int)pEStack_28->tp <= pCStack_18->tp)) {
    pCStack_18->tp = pCStack_18->tp - (int)pEStack_28->tp;
    local_2c = (int)pEStack_28->hp;
    pWVar1 = this->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"LimitDamage",&local_51);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_50);
    bVar2 = util::variant::operator_cast_to_bool(this_00);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (bVar2) {
      local_68[0] = pCStack_18->maxhp - pCStack_18->hp;
      piVar4 = std::min<int>(&local_2c,local_68);
      local_2c = *piVar4;
    }
    builder.add_size._4_4_ = 0;
    piVar4 = std::max<int>(&local_2c,(int *)((long)&builder.add_size + 4));
    local_2c = *piVar4;
    pCStack_18->hp = pCStack_18->hp + local_2c;
    piVar4 = std::min<int>(&pCStack_18->hp,&pCStack_18->maxhp);
    pCStack_18->hp = *piVar4;
    PacketBuilder::PacketBuilder((PacketBuilder *)local_a0,PACKET_SPELL,PACKET_TARGET_SELF,0xf);
    iVar3 = Character::PlayerID(pCStack_18);
    PacketBuilder::AddShort((PacketBuilder *)local_a0,iVar3);
    PacketBuilder::AddShort((PacketBuilder *)local_a0,(uint)spell._6_2_);
    PacketBuilder::AddInt((PacketBuilder *)local_a0,(int)pEStack_28->hp);
    local_a4 = (int)(((double)pCStack_18->hp / (double)pCStack_18->maxhp) * 100.0);
    local_a8 = 0;
    __range1._4_4_ = 100;
    iVar3 = util::clamp<int>(&local_a4,&local_a8,(int *)((long)&__range1 + 4));
    PacketBuilder::AddChar((PacketBuilder *)local_a0,iVar3);
    __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters)
    ;
    character = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                          (&this->characters);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&character), bVar2) {
      ppCVar5 = std::_List_iterator<Character_*>::operator*(&__end1);
      other = *ppCVar5;
      if ((other != pCStack_18) && (bVar2 = Character::InRange(pCStack_18,other), bVar2)) {
        Character::Send(other,(PacketBuilder *)local_a0);
      }
      std::_List_iterator<Character_*>::operator++(&__end1);
    }
    PacketBuilder::AddShort((PacketBuilder *)local_a0,pCStack_18->hp);
    PacketBuilder::AddShort((PacketBuilder *)local_a0,pCStack_18->tp);
    PacketBuilder::AddShort((PacketBuilder *)local_a0,1);
    Character::Send(pCStack_18,(PacketBuilder *)local_a0);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_a0);
  }
  return;
}

Assistant:

void Map::SpellSelf(Character *from, unsigned short spell_id)
{
	const ESF_Data& spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int hpgain = spell.hp;

	if (this->world->config["LimitDamage"])
		hpgain = std::min(hpgain, from->maxhp - from->hp);

	hpgain = std::max(hpgain, 0);

	from->hp += hpgain;

	from->hp = std::min(from->hp, from->maxhp);

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_SELF, 15);
	builder.AddShort(from->PlayerID());
	builder.AddShort(spell_id);
	builder.AddInt(spell.hp);
	builder.AddChar(util::clamp<int>(double(from->hp) / double(from->maxhp) * 100.0, 0, 100));

	UTIL_FOREACH(this->characters, character)
	{
		if (character != from && from->InRange(character))
			character->Send(builder);
	}

	builder.AddShort(from->hp);
	builder.AddShort(from->tp);
	builder.AddShort(1);

	from->Send(builder);
}